

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

void __thiscall
FastVector<unsigned_int_*,_false,_false>::grow_and_add
          (FastVector<unsigned_int_*,_false,_false> *this,uint newSize,uint **val)

{
  uint uVar1;
  uint **ppuVar2;
  uint *puVar3;
  
  ppuVar2 = this->data;
  grow_no_destroy(this,newSize);
  puVar3 = *val;
  uVar1 = this->count;
  this->count = uVar1 + 1;
  this->data[uVar1] = puVar3;
  if (ppuVar2 != (uint **)0x0) {
    (*(code *)NULLC::dealloc)(ppuVar2);
    return;
  }
  return;
}

Assistant:

void grow_and_add(unsigned newSize, const T& val)
	{
		T* oldData = data;
		unsigned oldMax = max;

		grow_no_destroy(newSize);

		data[count++] = val;

		if(oldData)
		{
			if(!skipConstructor)
				NULLC::destruct(oldData, oldMax);
			else
				NULLC::alignedDealloc(oldData);
		}
	}